

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O2

void __thiscall amrex::BLBTer::~BLBTer(BLBTer *this)

{
  pop_bt_stack(this);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

BLBTer::~BLBTer()
{
#ifdef AMREX_USE_OMP
    if (omp_in_parallel()) {
        pop_bt_stack();
    }
    else {
        #pragma omp parallel
        {
            pop_bt_stack();
        }
    }
#else
    pop_bt_stack();
#endif
}